

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BacktrackingTokenStream.h
# Opt level: O2

bool __thiscall
SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SeekTo
          (BacktrackingTokenStream<SGParser::Generator::RegExprParseToken> *this,size_t index)

{
  size_t sVar1;
  StreamBlock *pSVar2;
  ulong uVar3;
  StreamBlock *pSVar4;
  
  uVar3 = this->pThisBlock->Index;
  if ((index < uVar3) || (sVar1 = this->pThisBlock->Count, sVar1 == 0x200 || index < sVar1 + uVar3))
  {
    if (index < this->pFirstBlock->Index) {
      return false;
    }
    pSVar2 = this->pFirstBlock;
    if (this->Pos < index) {
      return false;
    }
    do {
      pSVar4 = pSVar2;
      uVar3 = pSVar4->Index;
      if (index < pSVar4->Count + uVar3) break;
      pSVar2 = pSVar4->pNext;
    } while (pSVar4->pNext != (StreamBlock *)0x0);
    this->pThisBlock = pSVar4;
  }
  this->ThisPos = index - uVar3;
  return true;
}

Assistant:

bool BacktrackingTokenStream<Token>::SeekTo(size_t index) noexcept {
    // if this is not in our current block
    if (!(pThisBlock->Index <= index &&
          pThisBlock->Index + pThisBlock->Count <= index &&
          pThisBlock->Count != StreamBlock::BufferSize)) {
        // Otherwise seek from beginning
        // Check bounds
        if (index < pFirstBlock->Index || index > Pos)
            return false;
        // And seek till block that contains our index
        pThisBlock = pFirstBlock;
        while (index >= pThisBlock->Index + pThisBlock->Count && pThisBlock->pNext)
            pThisBlock = pThisBlock->pNext;
    }

    // Update index
    ThisPos = index - pThisBlock->Index;
    return true;
}